

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateResetKeep(zng_stream *strm)

{
  internal_state *piVar1;
  int iVar2;
  uint32_t uVar3;
  zng_stream *in_RDI;
  deflate_state *s;
  int32_t local_4;
  
  iVar2 = deflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    in_RDI->total_out = 0;
    in_RDI->total_in = 0;
    in_RDI->msg = (char *)0x0;
    in_RDI->data_type = 2;
    piVar1 = in_RDI->state;
    piVar1->pending = 0;
    piVar1->pending_out = piVar1->pending_buf;
    if (piVar1->wrap < 0) {
      piVar1->wrap = -piVar1->wrap;
    }
    iVar2 = 1;
    if (piVar1->wrap == 2) {
      iVar2 = 4;
    }
    piVar1->status = iVar2;
    if (piVar1->wrap == 2) {
      uVar3 = (*functable.crc32_fold_reset)(&piVar1->crc_fold);
      in_RDI->adler = uVar3;
    }
    else {
      in_RDI->adler = 1;
    }
    piVar1->last_flush = -2;
    zng_tr_init((deflate_state *)0x107702);
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateResetKeep)(PREFIX3(stream) *strm) {
    deflate_state *s;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;

    strm->total_in = strm->total_out = 0;
    strm->msg = NULL; /* use zfree if we ever allocate msg dynamically */
    strm->data_type = Z_UNKNOWN;

    s = (deflate_state *)strm->state;
    s->pending = 0;
    s->pending_out = s->pending_buf;

    if (s->wrap < 0)
        s->wrap = -s->wrap; /* was made negative by deflate(..., Z_FINISH); */

    s->status =
#ifdef GZIP
        s->wrap == 2 ? GZIP_STATE :
#endif
        INIT_STATE;

#ifdef GZIP
    if (s->wrap == 2) {
        strm->adler = FUNCTABLE_CALL(crc32_fold_reset)(&s->crc_fold);
    } else
#endif
        strm->adler = ADLER32_INITIAL_VALUE;
    s->last_flush = -2;

    zng_tr_init(s);

    DEFLATE_RESET_KEEP_HOOK(strm);  /* hook for IBM Z DFLTCC */

    return Z_OK;
}